

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

int getFullTerritoryNameInLocaleInAlphabetUtf8
              (char *territoryName,Territory territory,int alternative,char *locale,
              Alphabet alphabet)

{
  Alphabet alphabet_local;
  char *locale_local;
  int alternative_local;
  Territory territory_local;
  char *territoryName_local;
  
  if ((alphabet < ALPHABET_ROMAN) || (ALPHABET_GUJARATI < alphabet)) {
    *territoryName = '\0';
    territoryName_local._4_4_ = 0;
  }
  else {
    territoryName_local._4_4_ =
         getFullTerritoryName_internal(territoryName,territory,alternative,locale,alphabet);
  }
  return territoryName_local._4_4_;
}

Assistant:

int getFullTerritoryNameInLocaleInAlphabetUtf8(char *territoryName, enum Territory territory, int alternative,
                                               const char *locale, enum Alphabet alphabet) {
    ASSERT(territoryName);
    ASSERT((_TERRITORY_MIN < territory) && (territory < _TERRITORY_MAX));
    if ((alphabet <= _ALPHABET_MIN) || (alphabet >= _ALPHABET_MAX)) {
        *territoryName = 0;
        return 0;
    }
    return getFullTerritoryName_internal(territoryName, territory, alternative, locale, alphabet);
}